

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int fputc_wrapper(uchar outc,void *f)

{
  int iVar1;
  undefined3 in_register_00000039;
  
  iVar1 = fputc(CONCAT31(in_register_00000039,outc),(FILE *)f);
  return (int)(iVar1 != CONCAT31(in_register_00000039,outc));
}

Assistant:

static int fputc_wrapper(unsigned char outc, void *f)
{
  int out = outc;
  FILE *s = f;
  int rc = fputc(out, s);
  if(rc == out)
    return 0;
  return 1;
}